

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O3

void TestConstExpr::ComparisonTestTU<unsigned_char,unsigned_int>(void)

{
  if (ComparisonTestTU<unsigned_char,unsigned_int>()::b1 == '\0') {
    ComparisonTestTU<unsigned_char,unsigned_int>();
  }
  if (ComparisonTestTU<unsigned_char,unsigned_int>()::b2 == '\0') {
    ComparisonTestTU<unsigned_char,unsigned_int>();
  }
  if (ComparisonTestTU<unsigned_char,unsigned_int>()::b3 == '\0') {
    ComparisonTestTU<unsigned_char,unsigned_int>();
  }
  if (ComparisonTestTU<unsigned_char,unsigned_int>()::b4 == '\0') {
    ComparisonTestTU<unsigned_char,unsigned_int>();
  }
  if (ComparisonTestTU<unsigned_char,unsigned_int>()::b5 == '\0') {
    ComparisonTestTU<unsigned_char,unsigned_int>();
  }
  if (ComparisonTestTU<unsigned_char,unsigned_int>()::b6 == '\0') {
    ComparisonTestTU<unsigned_char,unsigned_int>();
  }
  return;
}

Assistant:

void ComparisonTestTU()
	{
		static bool b1 = LessThanTest<T, U>();
		static bool b2 = LessThanEqualTest<T, U>();
		static bool b3 = GreaterThanTest<T, U>();
		static bool b4 = GreaterThanEqualTest<T, U>();
		static bool b5 = EqualTest<T, U>();
		static bool b6 = NotEqualTest<T, U>();
	}